

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O1

void __thiscall
spirv_cross::CompilerGLSL::access_chain_internal_append_index
          (CompilerGLSL *this,string *expr,uint32_t param_2,SPIRType *param_3,AccessChainFlags flags
          ,bool *access_chain_is_arrayed,uint32_t index)

{
  undefined8 *puVar1;
  bool bVar2;
  char cVar3;
  char cVar4;
  ulong uVar5;
  ulong uVar6;
  undefined8 *puVar7;
  long *plVar8;
  long *plVar9;
  uint32_t uVar10;
  CompilerGLSL *this_00;
  undefined8 uVar11;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str_1;
  string idx_expr;
  string expr_back;
  string expr_front;
  undefined8 *local_108;
  undefined8 local_100;
  undefined8 local_f8;
  undefined8 uStack_f0;
  ulong *local_e8;
  long local_e0;
  ulong local_d8 [2];
  string local_c8;
  string local_a8;
  undefined1 *local_88 [2];
  undefined1 local_78 [16];
  undefined1 *local_68;
  long local_60;
  undefined1 local_58 [16];
  long *local_48;
  long local_40;
  long local_38;
  long lStack_30;
  
  if ((flags & 1) == 0) {
    to_unpacked_expression_abi_cxx11_(&local_a8,this,index,(flags & 8) == 0);
  }
  else {
    cVar4 = '\x01';
    if (9 < index) {
      uVar10 = index;
      cVar3 = '\x04';
      do {
        cVar4 = cVar3;
        if (uVar10 < 100) {
          cVar4 = cVar4 + -2;
          goto LAB_00349897;
        }
        if (uVar10 < 1000) {
          cVar4 = cVar4 + -1;
          goto LAB_00349897;
        }
        if (uVar10 < 10000) goto LAB_00349897;
        bVar2 = 99999 < uVar10;
        uVar10 = uVar10 / 10000;
        cVar3 = cVar4 + '\x04';
      } while (bVar2);
      cVar4 = cVar4 + '\x01';
    }
LAB_00349897:
    local_a8._M_dataplus._M_p = (pointer)&local_a8.field_2;
    ::std::__cxx11::string::_M_construct((ulong)&local_a8,cVar4);
    ::std::__detail::__to_chars_10_impl<unsigned_int>
              (local_a8._M_dataplus._M_p,(uint)local_a8._M_string_length,index);
  }
  if (((flags & 4) != 0) && (*access_chain_is_arrayed == true)) {
    uVar5 = ::std::__cxx11::string::rfind((char)expr,0x5d);
    uVar6 = ::std::__cxx11::string::rfind((char)expr,0x29);
    if (uVar6 < uVar5 || uVar6 == 0xffffffffffffffff) {
      ::std::__cxx11::string::substr((ulong)&local_68,(ulong)expr);
      ::std::__cxx11::string::substr((ulong)local_88,(ulong)expr);
      local_e8 = local_d8;
      ::std::__cxx11::string::_M_construct<char*>((string *)&local_e8,local_68,local_68 + local_60);
      this_00 = (CompilerGLSL *)0x3fe36f;
      ::std::__cxx11::string::append((char *)&local_e8);
      enclose_expression(&local_c8,this_00,&local_a8);
      uVar5 = 0xf;
      if (local_e8 != local_d8) {
        uVar5 = local_d8[0];
      }
      if (uVar5 < local_c8._M_string_length + local_e0) {
        uVar11 = 0xf;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
          uVar11 = local_c8.field_2._M_allocated_capacity;
        }
        if ((ulong)uVar11 < local_c8._M_string_length + local_e0) goto LAB_00349a13;
        puVar7 = (undefined8 *)
                 ::std::__cxx11::string::replace((ulong)&local_c8,0,(char *)0x0,(ulong)local_e8);
      }
      else {
LAB_00349a13:
        puVar7 = (undefined8 *)
                 ::std::__cxx11::string::_M_append
                           ((char *)&local_e8,(ulong)local_c8._M_dataplus._M_p);
      }
      local_108 = &local_f8;
      puVar1 = puVar7 + 2;
      if ((undefined8 *)*puVar7 == puVar1) {
        local_f8 = *puVar1;
        uStack_f0 = puVar7[3];
      }
      else {
        local_f8 = *puVar1;
        local_108 = (undefined8 *)*puVar7;
      }
      local_100 = puVar7[1];
      *puVar7 = puVar1;
      puVar7[1] = 0;
      *(undefined1 *)puVar1 = 0;
      plVar8 = (long *)::std::__cxx11::string::_M_append((char *)&local_108,(ulong)local_88[0]);
      plVar9 = plVar8 + 2;
      if ((long *)*plVar8 == plVar9) {
        local_38 = *plVar9;
        lStack_30 = plVar8[3];
        local_48 = &local_38;
      }
      else {
        local_38 = *plVar9;
        local_48 = (long *)*plVar8;
      }
      local_40 = plVar8[1];
      *plVar8 = (long)plVar9;
      plVar8[1] = 0;
      *(undefined1 *)(plVar8 + 2) = 0;
      ::std::__cxx11::string::operator=((string *)expr,(string *)&local_48);
      if (local_48 != &local_38) {
        operator_delete(local_48);
      }
      if (local_108 != &local_f8) {
        operator_delete(local_108);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
        operator_delete(local_c8._M_dataplus._M_p);
      }
      if (local_e8 != local_d8) {
        operator_delete(local_e8);
      }
      if (local_88[0] != local_78) {
        operator_delete(local_88[0]);
      }
      if (local_68 != local_58) {
        operator_delete(local_68);
      }
      goto LAB_0034993a;
    }
  }
  ::std::__cxx11::string::append((char *)expr);
  ::std::__cxx11::string::_M_append((char *)expr,(ulong)local_a8._M_dataplus._M_p);
  ::std::__cxx11::string::append((char *)expr);
LAB_0034993a:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
    operator_delete(local_a8._M_dataplus._M_p);
  }
  return;
}

Assistant:

void CompilerGLSL::access_chain_internal_append_index(std::string &expr, uint32_t /*base*/, const SPIRType * /*type*/,
                                                      AccessChainFlags flags, bool &access_chain_is_arrayed,
                                                      uint32_t index)
{
	bool index_is_literal = (flags & ACCESS_CHAIN_INDEX_IS_LITERAL_BIT) != 0;
	bool ptr_chain = (flags & ACCESS_CHAIN_PTR_CHAIN_BIT) != 0;
	bool register_expression_read = (flags & ACCESS_CHAIN_SKIP_REGISTER_EXPRESSION_READ_BIT) == 0;

	string idx_expr = index_is_literal ? convert_to_string(index) : to_unpacked_expression(index, register_expression_read);

	// For the case where the base of an OpPtrAccessChain already ends in [n],
	// we need to use the index as an offset to the existing index, otherwise,
	// we can just use the index directly.
	if (ptr_chain && access_chain_is_arrayed)
	{
		size_t split_pos = expr.find_last_of(']');
		size_t enclose_split = expr.find_last_of(')');

		// If we have already enclosed the expression, don't try to be clever, it will break.
		if (split_pos > enclose_split || enclose_split == string::npos)
		{
			string expr_front = expr.substr(0, split_pos);
			string expr_back = expr.substr(split_pos);
			expr = expr_front + " + " + enclose_expression(idx_expr) + expr_back;
			return;
		}
	}

	expr += "[";
	expr += idx_expr;
	expr += "]";
}